

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactorDebug.cpp
# Opt level: O3

void debugReportRankDeficiency
               (HighsInt call_id,HighsInt highs_debug_level,HighsLogOptions *log_options,
               HighsInt num_row,vector<int,_std::allocator<int>_> *permute,
               vector<int,_std::allocator<int>_> *iwork,HighsInt *basic_index,
               HighsInt rank_deficiency,vector<int,_std::allocator<int>_> *row_with_no_pivot,
               vector<int,_std::allocator<int>_> *col_with_no_pivot)

{
  char *format;
  uint uVar1;
  ulong uVar2;
  HighsInt i;
  ulong uVar3;
  
  if (highs_debug_level == 0) {
    return;
  }
  if (call_id == 1) {
    if (100 < rank_deficiency) {
      return;
    }
    highsLogDev(log_options,kWarning,"buildRankDeficiency1:");
    highsLogDev(log_options,kWarning,"\nIndex  ");
    if (rank_deficiency < 1) {
      highsLogDev(log_options,kWarning,"\nrow_with_no_pivot  ");
LAB_003731d6:
      highsLogDev(log_options,kWarning,"\ncol_with_no_pivot  ");
    }
    else {
      uVar2 = 0;
      do {
        highsLogDev(log_options,kWarning," %2d",uVar2);
        uVar1 = (int)uVar2 + 1;
        uVar2 = (ulong)uVar1;
      } while (rank_deficiency != uVar1);
      highsLogDev(log_options,kWarning,"\nrow_with_no_pivot  ");
      if (rank_deficiency < 1) goto LAB_003731d6;
      uVar2 = 0;
      do {
        highsLogDev(log_options,kWarning," %2d",
                    (ulong)(uint)(row_with_no_pivot->super__Vector_base<int,_std::allocator<int>_>).
                                 _M_impl.super__Vector_impl_data._M_start[uVar2]);
        uVar2 = uVar2 + 1;
      } while ((uint)rank_deficiency != uVar2);
      highsLogDev(log_options,kWarning,"\ncol_with_no_pivot  ");
      if (0 < rank_deficiency) {
        uVar2 = 0;
        do {
          highsLogDev(log_options,kWarning," %2d",
                      (ulong)(uint)(col_with_no_pivot->super__Vector_base<int,_std::allocator<int>_>
                                   )._M_impl.super__Vector_impl_data._M_start[uVar2]);
          uVar2 = uVar2 + 1;
        } while ((uint)rank_deficiency != uVar2);
      }
    }
    highsLogDev(log_options,kWarning,"\n");
    if (0x7b < num_row) {
      return;
    }
    highsLogDev(log_options,kWarning,"Index  ");
    if (0 < num_row) {
      uVar2 = 0;
      do {
        highsLogDev(log_options,kWarning," %2d",uVar2);
        uVar1 = (int)uVar2 + 1;
        uVar2 = (ulong)uVar1;
      } while (num_row != uVar1);
      highsLogDev(log_options,kWarning,"\nIwork  ");
      if (0 < num_row) {
        uVar2 = 0;
        do {
          highsLogDev(log_options,kWarning," %2d",
                      (ulong)(uint)(iwork->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_start[uVar2]);
          uVar2 = uVar2 + 1;
        } while ((uint)num_row != uVar2);
      }
      goto LAB_003732ca;
    }
    format = "\nIwork  ";
  }
  else if (call_id == 0) {
    if (0x7b < num_row) {
      return;
    }
    highsLogDev(log_options,kWarning,"buildRankDeficiency0:");
    highsLogDev(log_options,kWarning,"\nIndex  ");
    if (num_row < 1) {
      highsLogDev(log_options,kWarning,"\nPerm   ");
LAB_0037319e:
      highsLogDev(log_options,kWarning,"\nIwork  ");
    }
    else {
      uVar2 = 0;
      do {
        highsLogDev(log_options,kWarning," %2d",uVar2);
        uVar1 = (int)uVar2 + 1;
        uVar2 = (ulong)uVar1;
      } while (num_row != uVar1);
      highsLogDev(log_options,kWarning,"\nPerm   ");
      if (num_row < 1) goto LAB_0037319e;
      uVar2 = (ulong)(uint)num_row;
      uVar3 = 0;
      do {
        highsLogDev(log_options,kWarning," %2d",
                    (ulong)(uint)(permute->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_start[uVar3]);
        uVar3 = uVar3 + 1;
      } while (uVar2 != uVar3);
      highsLogDev(log_options,kWarning,"\nIwork  ");
      if (0 < num_row) {
        uVar3 = 0;
        do {
          highsLogDev(log_options,kWarning," %2d",
                      (ulong)(uint)(iwork->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_start[uVar3]);
          uVar3 = uVar3 + 1;
        } while (uVar2 != uVar3);
        highsLogDev(log_options,kWarning,"\nBaseI  ");
        if (0 < num_row) {
          uVar3 = 0;
          do {
            highsLogDev(log_options,kWarning," %2d",(ulong)(uint)basic_index[uVar3]);
            uVar3 = uVar3 + 1;
          } while (uVar2 != uVar3);
        }
        goto LAB_003732ca;
      }
    }
    format = "\nBaseI  ";
  }
  else {
    if (0x7b < num_row || call_id != 2) {
      return;
    }
    highsLogDev(log_options,kWarning,"buildRankDeficiency2:");
    highsLogDev(log_options,kWarning,"\nIndex  ");
    if (0 < num_row) {
      uVar2 = 0;
      do {
        highsLogDev(log_options,kWarning," %2d",uVar2);
        uVar1 = (int)uVar2 + 1;
        uVar2 = (ulong)uVar1;
      } while (num_row != uVar1);
      highsLogDev(log_options,kWarning,"\nPerm   ");
      if (0 < num_row) {
        uVar2 = 0;
        do {
          highsLogDev(log_options,kWarning," %2d",
                      (ulong)(uint)(permute->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_start[uVar2]);
          uVar2 = uVar2 + 1;
        } while ((uint)num_row != uVar2);
      }
      goto LAB_003732ca;
    }
    format = "\nPerm   ";
  }
  highsLogDev(log_options,kWarning,format);
LAB_003732ca:
  highsLogDev(log_options,kWarning,"\n");
  return;
}

Assistant:

void debugReportRankDeficiency(
    const HighsInt call_id, const HighsInt highs_debug_level,
    const HighsLogOptions& log_options, const HighsInt num_row,
    const vector<HighsInt>& permute, const vector<HighsInt>& iwork,
    const HighsInt* basic_index, const HighsInt rank_deficiency,
    const vector<HighsInt>& row_with_no_pivot,
    const vector<HighsInt>& col_with_no_pivot) {
  if (highs_debug_level == kHighsDebugLevelNone) return;
  if (call_id == 0) {
    if (num_row > 123) return;
    highsLogDev(log_options, HighsLogType::kWarning, "buildRankDeficiency0:");
    highsLogDev(log_options, HighsLogType::kWarning, "\nIndex  ");
    for (HighsInt i = 0; i < num_row; i++)
      highsLogDev(log_options, HighsLogType::kWarning, " %2" HIGHSINT_FORMAT "",
                  i);
    highsLogDev(log_options, HighsLogType::kWarning, "\nPerm   ");
    for (HighsInt i = 0; i < num_row; i++)
      highsLogDev(log_options, HighsLogType::kWarning, " %2" HIGHSINT_FORMAT "",
                  permute[i]);
    highsLogDev(log_options, HighsLogType::kWarning, "\nIwork  ");
    for (HighsInt i = 0; i < num_row; i++)
      highsLogDev(log_options, HighsLogType::kWarning, " %2" HIGHSINT_FORMAT "",
                  iwork[i]);
    highsLogDev(log_options, HighsLogType::kWarning, "\nBaseI  ");
    for (HighsInt i = 0; i < num_row; i++)
      highsLogDev(log_options, HighsLogType::kWarning, " %2" HIGHSINT_FORMAT "",
                  basic_index[i]);
    highsLogDev(log_options, HighsLogType::kWarning, "\n");
  } else if (call_id == 1) {
    if (rank_deficiency > 100) return;
    highsLogDev(log_options, HighsLogType::kWarning, "buildRankDeficiency1:");
    highsLogDev(log_options, HighsLogType::kWarning, "\nIndex  ");
    for (HighsInt i = 0; i < rank_deficiency; i++)
      highsLogDev(log_options, HighsLogType::kWarning, " %2" HIGHSINT_FORMAT "",
                  i);
    highsLogDev(log_options, HighsLogType::kWarning, "\nrow_with_no_pivot  ");
    for (HighsInt i = 0; i < rank_deficiency; i++)
      highsLogDev(log_options, HighsLogType::kWarning, " %2" HIGHSINT_FORMAT "",
                  row_with_no_pivot[i]);
    highsLogDev(log_options, HighsLogType::kWarning, "\ncol_with_no_pivot  ");
    for (HighsInt i = 0; i < rank_deficiency; i++)
      highsLogDev(log_options, HighsLogType::kWarning, " %2" HIGHSINT_FORMAT "",
                  col_with_no_pivot[i]);
    highsLogDev(log_options, HighsLogType::kWarning, "\n");
    if (num_row > 123) return;
    highsLogDev(log_options, HighsLogType::kWarning, "Index  ");
    for (HighsInt i = 0; i < num_row; i++)
      highsLogDev(log_options, HighsLogType::kWarning, " %2" HIGHSINT_FORMAT "",
                  i);
    highsLogDev(log_options, HighsLogType::kWarning, "\nIwork  ");
    for (HighsInt i = 0; i < num_row; i++)
      highsLogDev(log_options, HighsLogType::kWarning, " %2" HIGHSINT_FORMAT "",
                  iwork[i]);
    highsLogDev(log_options, HighsLogType::kWarning, "\n");
  } else if (call_id == 2) {
    if (num_row > 123) return;
    highsLogDev(log_options, HighsLogType::kWarning, "buildRankDeficiency2:");
    highsLogDev(log_options, HighsLogType::kWarning, "\nIndex  ");
    for (HighsInt i = 0; i < num_row; i++)
      highsLogDev(log_options, HighsLogType::kWarning, " %2" HIGHSINT_FORMAT "",
                  i);
    highsLogDev(log_options, HighsLogType::kWarning, "\nPerm   ");
    for (HighsInt i = 0; i < num_row; i++)
      highsLogDev(log_options, HighsLogType::kWarning, " %2" HIGHSINT_FORMAT "",
                  permute[i]);
    highsLogDev(log_options, HighsLogType::kWarning, "\n");
  }
}